

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::SSLClient::connect_with_proxy
          (SSLClient *this,Socket *socket,Response *res,bool *success,Error *error)

{
  socket_t sVar1;
  time_t tVar2;
  time_t tVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  time_t tVar5;
  pthread_t pVar6;
  SSLClient *this_00;
  char cVar7;
  bool bVar8;
  pthread_t pVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  auth;
  Response res3;
  Response res2;
  undefined8 *local_318;
  undefined8 uStack_310;
  code *local_308;
  code *pcStack_300;
  undefined8 *local_2f8;
  undefined8 uStack_2f0;
  code *local_2e8;
  code *pcStack_2e0;
  time_t local_2d8;
  SSLClient *local_2d0;
  undefined **local_2c8;
  socket_t local_2c0;
  time_t local_2b8;
  time_t local_2b0;
  time_t local_2a8;
  time_t local_2a0;
  void *local_298;
  void *pvStack_290;
  long local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  Response local_240;
  Response local_138;
  
  *success = true;
  local_138.version._M_dataplus._M_p = (pointer)&local_138.version.field_2;
  local_138.version._M_string_length = 0;
  local_138.version.field_2._M_local_buf[0] = '\0';
  local_138.status = -1;
  local_138.reason._M_dataplus._M_p = (pointer)&local_138.reason.field_2;
  local_138.reason._M_string_length = 0;
  local_138.reason.field_2._M_local_buf[0] = '\0';
  local_138.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_138.headers._M_t._M_impl.super__Rb_tree_header._M_header;
  local_138.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_138.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_138.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138.body._M_dataplus._M_p = (pointer)&local_138.body.field_2;
  local_138.body._M_string_length = 0;
  local_138.body.field_2._M_local_buf[0] = '\0';
  local_138.location._M_dataplus._M_p = (pointer)&local_138.location.field_2;
  local_138.location._M_string_length = 0;
  local_138.location.field_2._M_local_buf[0] = '\0';
  local_138.content_length_ = 0;
  local_138.content_provider_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_138.content_provider_.super__Function_base._M_functor._8_8_ = 0;
  local_138.content_provider_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_138.content_provider_._M_invoker = (_Invoker_type)0x0;
  local_138.content_provider_resource_releaser_.super__Function_base._M_functor._M_unused._M_object
       = (void *)0x0;
  local_138.content_provider_resource_releaser_.super__Function_base._M_functor._8_8_ = 0;
  local_138.content_provider_resource_releaser_.super__Function_base._M_manager._0_2_ = 0;
  local_138.content_provider_resource_releaser_.super__Function_base._M_manager._2_6_ = 0;
  local_138.content_provider_resource_releaser_._M_invoker._0_2_ = 0;
  local_138._250_8_ = 0;
  sVar1 = socket->sock;
  uVar10 = (this->super_ClientImpl).read_timeout_sec_;
  tVar2 = (this->super_ClientImpl).read_timeout_usec_;
  tVar3 = (this->super_ClientImpl).write_timeout_sec_;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this->super_ClientImpl).write_timeout_usec_;
  local_2e8 = (code *)0x0;
  pcStack_2e0 = (code *)0x0;
  local_2f8 = (undefined8 *)0x0;
  uStack_2f0 = 0;
  local_138.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_138.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2f8 = (undefined8 *)operator_new(0x18);
  *local_2f8 = this;
  local_2f8[1] = &local_138;
  local_2f8[2] = error;
  pcStack_2e0 = std::
                _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:7991:52)>
                ::_M_invoke;
  local_2e8 = std::
              _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:7991:52)>
              ::_M_manager;
  local_240.version._M_dataplus._M_p = (pointer)&PTR__SocketStream_0019fa58;
  local_240.version._M_string_length = CONCAT44(local_240.version._M_string_length._4_4_,sVar1);
  local_240.reason._M_string_length = 0;
  local_240.reason.field_2._M_allocated_capacity = 0;
  local_240.reason.field_2._8_8_ = 0;
  local_2d0 = this;
  local_240.version.field_2._M_allocated_capacity = uVar10;
  local_240.version.field_2._8_8_ = tVar2;
  local_240._32_8_ = tVar3;
  local_240.reason._M_dataplus._M_p = (pointer)paVar4;
  local_240.reason._M_string_length = (size_type)operator_new(0x1000);
  uVar10 = local_240.reason._M_string_length + 0x1000;
  local_240.reason.field_2._M_allocated_capacity = local_240.reason._M_string_length;
  local_240.reason.field_2._8_8_ = uVar10;
  memset((void *)local_240.reason._M_string_length,0,0x1000);
  local_240.headers._M_t._M_impl._0_8_ = 0;
  local_240.headers._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
  local_240.reason.field_2._M_allocated_capacity = uVar10;
  if (local_2e8 == (code *)0x0) {
    std::__throw_bad_function_call();
  }
  cVar7 = (*pcStack_2e0)(&local_2f8,&local_240);
  this_00 = local_2d0;
  local_240.version._M_dataplus._M_p = (pointer)&PTR__SocketStream_0019fa58;
  if ((void *)local_240.reason._M_string_length != (void *)0x0) {
    operator_delete((void *)local_240.reason._M_string_length,
                    local_240.reason.field_2._8_8_ - local_240.reason._M_string_length);
  }
  if (local_2e8 != (code *)0x0) {
    (*local_2e8)(&local_2f8,&local_2f8,3);
  }
  if (cVar7 == '\0') {
    (*(this_00->super_ClientImpl)._vptr_ClientImpl[4])(this_00,socket,1);
    if (socket->sock != -1) {
      shutdown(socket->sock,2);
    }
    if (((this_00->super_ClientImpl).socket_requests_in_flight_ != 0) &&
       (pVar6 = (this_00->super_ClientImpl).socket_requests_are_from_thread_._M_thread,
       pVar9 = pthread_self(), pVar6 != pVar9)) {
      __assert_fail("socket_requests_in_flight_ == 0 || socket_requests_are_from_thread_ == std::this_thread::get_id()"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h"
                    ,0x1897,"void httplib::ClientImpl::close_socket(Socket &)");
    }
    if (socket->ssl != (SSL *)0x0) {
      __assert_fail("socket.ssl == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h"
                    ,0x189b,"void httplib::ClientImpl::close_socket(Socket &)");
    }
    if (socket->sock != -1) {
      close(socket->sock);
      socket->sock = -1;
    }
    *success = false;
  }
  else {
    bVar12 = true;
    if (local_138.status != 0x197) goto LAB_0013bfd9;
    if (((this_00->super_ClientImpl).proxy_digest_auth_username_._M_string_length != 0) &&
       ((this_00->super_ClientImpl).proxy_digest_auth_password_._M_string_length != 0)) {
      local_270._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_270._M_impl.super__Rb_tree_header._M_header;
      local_270._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_270._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_270._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_270._M_impl.super__Rb_tree_header._M_header._M_right =
           local_270._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar8 = detail::parse_www_authenticate
                        (&local_138,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_270,true);
      if (bVar8) {
        local_240.version._M_dataplus._M_p = (pointer)&local_240.version.field_2;
        local_240.version._M_string_length = 0;
        local_240.version.field_2._M_allocated_capacity =
             local_240.version.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_240.status = 0xffffffff;
        local_240.reason._M_dataplus._M_p = (pointer)&local_240.reason.field_2;
        local_240.reason._M_string_length = 0;
        local_240.reason.field_2._M_allocated_capacity =
             local_240.reason.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_240.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_240.headers._M_t._M_impl.super__Rb_tree_header._M_header;
        local_240.headers._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             local_240.headers._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
             0xffffffff00000000;
        local_240.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_240.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_240.body._M_dataplus._M_p = (pointer)&local_240.body.field_2;
        local_240.body._M_string_length = 0;
        local_240.body.field_2._M_local_buf[0] = '\0';
        local_240.location._M_dataplus._M_p = (pointer)&local_240.location.field_2;
        local_240.location._M_string_length = 0;
        local_240.location.field_2._M_local_buf[0] = '\0';
        local_240.content_length_ = 0;
        local_240.content_provider_.super__Function_base._M_functor._M_unused._M_object =
             (void *)0x0;
        local_240.content_provider_.super__Function_base._M_functor._8_8_ = 0;
        local_240.content_provider_.super__Function_base._M_manager = (_Manager_type)0x0;
        local_240.content_provider_._M_invoker = (_Invoker_type)0x0;
        local_240.content_provider_resource_releaser_.super__Function_base._M_functor._M_unused.
        _M_object = (void *)0x0;
        local_240.content_provider_resource_releaser_.super__Function_base._M_functor._8_8_ = 0;
        local_240.content_provider_resource_releaser_.super__Function_base._M_manager._0_2_ = 0;
        local_240.content_provider_resource_releaser_.super__Function_base._M_manager._2_6_ = 0;
        local_240.content_provider_resource_releaser_._M_invoker._0_2_ = 0;
        local_240._250_8_ = 0;
        sVar1 = socket->sock;
        tVar2 = (this_00->super_ClientImpl).read_timeout_sec_;
        tVar3 = (this_00->super_ClientImpl).read_timeout_usec_;
        tVar5 = (this_00->super_ClientImpl).write_timeout_sec_;
        local_2d8 = (this_00->super_ClientImpl).write_timeout_usec_;
        local_308 = (code *)0x0;
        pcStack_300 = (code *)0x0;
        local_318 = (undefined8 *)0x0;
        uStack_310 = 0;
        local_240.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_240.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_318 = (undefined8 *)operator_new(0x20);
        *local_318 = this_00;
        local_318[1] = &local_270;
        local_318[2] = &local_240;
        local_318[3] = error;
        pcStack_300 = std::
                      _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:8014:58)>
                      ::_M_invoke;
        local_308 = std::
                    _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:8014:58)>
                    ::_M_manager;
        local_2c8 = &PTR__SocketStream_0019fa58;
        local_2a0 = local_2d8;
        local_298 = (void *)0x0;
        pvStack_290 = (void *)0x0;
        local_288 = 0;
        local_2c0 = sVar1;
        local_2b8 = tVar2;
        local_2b0 = tVar3;
        local_2a8 = tVar5;
        local_298 = operator_new(0x1000);
        lVar11 = (long)local_298 + 0x1000;
        pvStack_290 = local_298;
        local_288 = lVar11;
        memset(local_298,0,0x1000);
        local_280 = 0;
        uStack_278 = 0;
        pvStack_290 = (void *)lVar11;
        if (local_308 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        cVar7 = (*pcStack_300)(&local_318,&local_2c8);
        local_2c8 = &PTR__SocketStream_0019fa58;
        if (local_298 != (void *)0x0) {
          operator_delete(local_298,local_288 - (long)local_298);
        }
        if (local_308 != (code *)0x0) {
          (*local_308)(&local_318,&local_318,3);
        }
        if (cVar7 == '\0') {
          (*(this_00->super_ClientImpl)._vptr_ClientImpl[4])(this_00,socket,1);
          if (socket->sock != -1) {
            shutdown(socket->sock,2);
          }
          ClientImpl::close_socket(&this_00->super_ClientImpl,socket);
          *success = false;
          Response::~Response(&local_240);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_270);
          goto LAB_0013bfd7;
        }
        Response::~Response(&local_240);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_270);
      goto LAB_0013bfd9;
    }
    Response::operator=(res,&local_138);
  }
LAB_0013bfd7:
  bVar12 = false;
LAB_0013bfd9:
  Response::~Response(&local_138);
  return bVar12;
}

Assistant:

inline bool SSLClient::connect_with_proxy(Socket &socket, Response &res,
                                          bool &success, Error &error) {
  success = true;
  Response res2;
  if (!detail::process_client_socket(
          socket.sock, read_timeout_sec_, read_timeout_usec_,
          write_timeout_sec_, write_timeout_usec_, [&](Stream &strm) {
            Request req2;
            req2.method = "CONNECT";
            req2.path = host_and_port_;
            return process_request(strm, req2, res2, false, error);
          })) {
    // Thread-safe to close everything because we are assuming there are no
    // requests in flight
    shutdown_ssl(socket, true);
    shutdown_socket(socket);
    close_socket(socket);
    success = false;
    return false;
  }

  if (res2.status == 407) {
    if (!proxy_digest_auth_username_.empty() &&
        !proxy_digest_auth_password_.empty()) {
      std::map<std::string, std::string> auth;
      if (detail::parse_www_authenticate(res2, auth, true)) {
        Response res3;
        if (!detail::process_client_socket(
                socket.sock, read_timeout_sec_, read_timeout_usec_,
                write_timeout_sec_, write_timeout_usec_, [&](Stream &strm) {
                  Request req3;
                  req3.method = "CONNECT";
                  req3.path = host_and_port_;
                  req3.headers.insert(detail::make_digest_authentication_header(
                      req3, auth, 1, detail::random_string(10),
                      proxy_digest_auth_username_, proxy_digest_auth_password_,
                      true));
                  return process_request(strm, req3, res3, false, error);
                })) {
          // Thread-safe to close everything because we are assuming there are
          // no requests in flight
          shutdown_ssl(socket, true);
          shutdown_socket(socket);
          close_socket(socket);
          success = false;
          return false;
        }
      }
    } else {
      res = res2;
      return false;
    }
  }

  return true;
}